

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void print_dma(int d,DMACNTH_t *cnth,uint wc,DMAINT_t *dmaint,uint sad,uint dad)

{
  ushort *in_RSI;
  uint in_EDI;
  
  DUI_Print("%d: enable: %d, start time: %d irq: %d sadctrl: %d dadctrl: %d",(ulong)in_EDI,
            (ulong)(byte)(*in_RSI >> 0xf),(ulong)(*in_RSI >> 0xc & 3),
            (ulong)((byte)(*in_RSI >> 0xe) & 1),(ulong)(*in_RSI >> 7 & 3),(uint)(*in_RSI >> 5 & 3));
  DUI_Newline();
  return;
}

Assistant:

void print_dma(int d, DMACNTH_t *cnth, unsigned int wc, DMAINT_t *dmaint, unsigned int sad, unsigned int dad) {
    DUI_Println("%d: enable: %d, start time: %d irq: %d sadctrl: %d dadctrl: %d",
                d,
                cnth->dma_enable,
                cnth->dma_start_time,
                cnth->irq_on_end_of_wc,
                cnth->source_addr_control,
                cnth->dest_addr_control);
}